

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O1

void FFTProcess<float>(UnityComplexNumber *data,int numsamples,bool forward)

{
  float fVar1;
  bool bVar2;
  uint *puVar3;
  ulong uVar4;
  ulong uVar5;
  float *pfVar6;
  uint uVar7;
  ulong uVar8;
  float *pfVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  uVar4 = 0;
  if (1 < (uint)numsamples) {
    uVar7 = 1;
    do {
      uVar7 = uVar7 * 2;
      uVar12 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar12;
    } while (uVar7 < (uint)numsamples);
    uVar4 = (ulong)uVar12;
  }
  puVar3 = FFTProcess<float>::reversetable[uVar4];
  if (puVar3 == (uint *)0x0) {
    uVar5 = 0xffffffffffffffff;
    if (-1 < numsamples) {
      uVar5 = (long)numsamples << 2;
    }
    puVar3 = (uint *)operator_new__(uVar5);
    if (numsamples != 0) {
      uVar5 = 0;
      do {
        uVar7 = 0;
        if (numsamples != 1) {
          uVar12 = 1;
          uVar7 = 0;
          uVar10 = numsamples >> 1;
          do {
            uVar11 = uVar10 & (uint)uVar5;
            if (uVar11 != 0) {
              uVar11 = uVar12;
            }
            uVar7 = uVar7 | uVar11;
            uVar12 = uVar12 * 2;
            bVar2 = 1 < uVar10;
            uVar10 = uVar10 >> 1;
          } while (bVar2);
        }
        puVar3[uVar5] = uVar7;
        uVar5 = uVar5 + 1;
      } while (uVar5 != (uint)numsamples);
    }
    FFTProcess<float>::reversetable[uVar4] = puVar3;
  }
  if (numsamples != 0) {
    uVar4 = 0;
    do {
      uVar5 = (ulong)puVar3[uVar4];
      if (uVar4 < uVar5) {
        fVar13 = data[uVar4].re;
        data[uVar4].re = data[uVar5].re;
        data[uVar5].re = fVar13;
        fVar13 = data[uVar4].im;
        data[uVar4].im = data[uVar5].im;
        data[uVar5].im = fVar13;
      }
      uVar4 = uVar4 + 1;
    } while ((uint)numsamples != uVar4);
  }
  if (1 < numsamples) {
    if (forward) {
      fVar13 = -3.1415927;
    }
    else {
      fVar13 = 3.1415927;
    }
    uVar7 = 1;
    do {
      fVar14 = cosf(fVar13);
      fVar15 = sinf(fVar13);
      uVar12 = uVar7 * 2;
      if (0 < (int)uVar7) {
        uVar4 = (ulong)uVar7;
        uVar5 = 0;
        fVar16 = 1.0;
        pfVar6 = &data->im;
        fVar17 = 0.0;
        do {
          if ((int)uVar5 < numsamples) {
            uVar8 = uVar5 & 0xffffffff;
            pfVar9 = pfVar6;
            do {
              fVar20 = fVar16 * pfVar9[uVar4 * 2] + fVar17 * pfVar9[uVar4 * 2 + -1];
              fVar18 = pfVar9[uVar4 * 2 + -1] * fVar16 + pfVar9[uVar4 * 2] * -fVar17;
              fVar19 = ((UnityComplexNumber *)(pfVar9 + -1))->re;
              pfVar9[uVar4 * 2 + -1] = fVar19 - fVar18;
              fVar1 = *pfVar9;
              pfVar9[uVar4 * 2] = fVar1 - fVar20;
              ((UnityComplexNumber *)(pfVar9 + -1))->re = fVar18 + fVar19;
              *pfVar9 = fVar20 + fVar1;
              pfVar9 = pfVar9 + (ulong)uVar12 * 2;
              uVar7 = (int)uVar8 + uVar12;
              uVar8 = (ulong)uVar7;
            } while ((int)uVar7 < numsamples);
          }
          fVar19 = fVar16 * fVar15;
          fVar16 = fVar16 * fVar14 - fVar17 * fVar15;
          uVar5 = uVar5 + 1;
          pfVar6 = pfVar6 + 2;
          fVar17 = fVar19 + fVar14 * fVar17;
        } while (uVar5 != uVar4);
      }
      fVar13 = fVar13 * 0.5;
      uVar7 = uVar12;
    } while ((int)uVar12 < numsamples);
  }
  return;
}

Assistant:

static void FFTProcess(UnityComplexNumber* data, int numsamples, bool forward)
{
    unsigned int count = 1, numbits = 0;
    while (count < numsamples)
    {
        count += count;
        ++numbits;
    }

    static unsigned int* reversetable[32] = { NULL };
    unsigned int* tbl = reversetable[numbits];
    if (tbl == NULL)
    {
        tbl = new unsigned int[numsamples];
        for (unsigned int n = 0; n < numsamples; n++)
        {
            unsigned int j = 1, k = 0, m = numsamples >> 1;
            while (m > 0)
            {
                if (n & m)
                    k |= j;
                j += j;
                m >>= 1;
            }
            tbl[n] = k;
        }
#if ENABLE_TESTS
        for (unsigned int n = 0; n < numsamples; n++)
        {
            assert(tbl[tbl[n]] == n);
        }
#endif
        reversetable[numbits] = tbl;
    }

    for (unsigned int i = 0; i < numsamples; i++)
    {
        unsigned int j = tbl[i];
        if (i < j)
        {
            UnitySwap(data[i].re, data[j].re);
            UnitySwap(data[i].im, data[j].im);
        }
    }

    T w0 = (forward) ? -T(kPI_double) : T(kPI_double);
    for (int j = 1; j < numsamples; j += j)
    {
        UnityComplexNumberT<T> wr, wd;
        wr.Set(T(cos(w0)), T(sin(w0)));
        wd.Set(T(1.0), T(0.0));
        int step = j + j;
        for (int m = 0; m < j; ++m)
        {
            for (int i = m; i < numsamples; i += step)
            {
                UnityComplexNumberT<T> t;
                UnityComplexNumber::Mul(wd, data[i + j], t);
                UnityComplexNumber::Sub(data[i], t, data[i + j]);
                UnityComplexNumber::Add(data[i], t, data[i]);
            }
            UnityComplexNumber::Mul(wd, wr, wd);
        }
        w0 *= T(0.5);
    }
}